

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureGatherTests.cpp
# Opt level: O0

vector<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs>_>
* deqp::gles31::Functional::anon_unknown_0::generateBasic2DCaseIterations
            (vector<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs>_>
             *__return_storage_ptr__,GatherType gatherType,TextureFormat *textureFormat,
            IVec2 *offsetRange)

{
  bool bVar1;
  int iVar2;
  Vector<int,_2> local_354;
  Vector<int,_2> local_34c;
  Vector<int,_2> local_344;
  Vector<int,_2> local_33c;
  GatherArgs local_334;
  Vector<int,_2> local_310;
  Vector<int,_2> local_308;
  Vector<int,_2> local_300;
  Vector<int,_2> local_2f8;
  GatherArgs local_2f0;
  int local_2cc;
  int local_2c8;
  int hmax_1;
  int hmin_1;
  int max_1;
  int min_1;
  Vector<int,_2> local_2b4;
  Vector<int,_2> local_2ac;
  Vector<int,_2> local_2a4;
  GatherArgs local_29c;
  Vector<int,_2> local_278;
  Vector<int,_2> local_270;
  Vector<int,_2> local_268;
  Vector<int,_2> local_260;
  GatherArgs local_258;
  Vector<int,_2> local_234;
  Vector<int,_2> local_22c;
  Vector<int,_2> local_224;
  Vector<int,_2> local_21c;
  GatherArgs local_214;
  Vector<int,_2> local_1f0;
  Vector<int,_2> local_1e8;
  Vector<int,_2> local_1e0;
  Vector<int,_2> local_1d8;
  GatherArgs local_1d0;
  Vector<int,_2> local_1ac;
  Vector<int,_2> local_1a4;
  Vector<int,_2> local_19c;
  Vector<int,_2> local_194;
  GatherArgs local_18c;
  Vector<int,_2> local_168;
  Vector<int,_2> local_160;
  Vector<int,_2> local_158;
  Vector<int,_2> local_150;
  GatherArgs local_148;
  Vector<int,_2> local_124;
  Vector<int,_2> local_11c;
  Vector<int,_2> local_114;
  Vector<int,_2> local_10c;
  GatherArgs local_104;
  Vector<int,_2> local_e0;
  Vector<int,_2> local_d8;
  Vector<int,_2> local_d0;
  Vector<int,_2> local_c8;
  GatherArgs local_c0;
  int local_9c;
  int local_98;
  int hmax;
  int hmin;
  int max;
  int min;
  Vector<int,_2> local_84;
  Vector<int,_2> local_7c [3];
  Vector<int,_2> local_64;
  GatherArgs local_5c;
  int local_38;
  int local_34;
  int componentNdx;
  int componentCaseNdx;
  IVec2 *pIStack_28;
  int numComponentCases;
  IVec2 *offsetRange_local;
  TextureFormat *textureFormat_local;
  vector<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs>_>
  *pvStack_10;
  GatherType gatherType_local;
  vector<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs>_>
  *result;
  
  pIStack_28 = offsetRange;
  offsetRange_local = (IVec2 *)textureFormat;
  textureFormat_local._4_4_ = gatherType;
  pvStack_10 = __return_storage_ptr__;
  bVar1 = isDepthFormat(textureFormat);
  componentCaseNdx = 5;
  if (bVar1) {
    componentCaseNdx = 1;
  }
  componentNdx._3_1_ = 0;
  std::
  vector<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs>_>
  ::vector(__return_storage_ptr__);
  for (local_34 = 0; local_34 < componentCaseNdx; local_34 = local_34 + 1) {
    iVar2 = local_34 + -1;
    local_38 = iVar2;
    switch(textureFormat_local._4_4_) {
    case GATHERTYPE_BASIC:
      tcu::Vector<int,_2>::Vector(&local_64);
      tcu::Vector<int,_2>::Vector(local_7c);
      tcu::Vector<int,_2>::Vector(&local_84);
      tcu::Vector<int,_2>::Vector((Vector<int,_2> *)&max);
      GatherArgs::GatherArgs(&local_5c,iVar2,&local_64,local_7c,&local_84,(IVec2 *)&max);
      std::
      vector<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs>_>
      ::push_back(__return_storage_ptr__,&local_5c);
      break;
    case GATHERTYPE_OFFSET:
      hmin = tcu::Vector<int,_2>::x(pIStack_28);
      hmax = tcu::Vector<int,_2>::y(pIStack_28);
      local_98 = divRoundToZero(hmin,2);
      local_9c = divRoundToZero(hmax,2);
      iVar2 = local_38;
      tcu::Vector<int,_2>::Vector(&local_c8,hmin,hmax);
      tcu::Vector<int,_2>::Vector(&local_d0);
      tcu::Vector<int,_2>::Vector(&local_d8);
      tcu::Vector<int,_2>::Vector(&local_e0);
      GatherArgs::GatherArgs(&local_c0,iVar2,&local_c8,&local_d0,&local_d8,&local_e0);
      std::
      vector<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs>_>
      ::push_back(__return_storage_ptr__,&local_c0);
      iVar2 = local_38;
      if (local_34 == 0) {
        tcu::Vector<int,_2>::Vector(&local_10c,hmin,hmin);
        tcu::Vector<int,_2>::Vector(&local_114);
        tcu::Vector<int,_2>::Vector(&local_11c);
        tcu::Vector<int,_2>::Vector(&local_124);
        GatherArgs::GatherArgs(&local_104,iVar2,&local_10c,&local_114,&local_11c,&local_124);
        std::
        vector<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs>_>
        ::push_back(__return_storage_ptr__,&local_104);
        iVar2 = local_38;
        tcu::Vector<int,_2>::Vector(&local_150,hmax,hmin);
        tcu::Vector<int,_2>::Vector(&local_158);
        tcu::Vector<int,_2>::Vector(&local_160);
        tcu::Vector<int,_2>::Vector(&local_168);
        GatherArgs::GatherArgs(&local_148,iVar2,&local_150,&local_158,&local_160,&local_168);
        std::
        vector<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs>_>
        ::push_back(__return_storage_ptr__,&local_148);
        iVar2 = local_38;
        tcu::Vector<int,_2>::Vector(&local_194,hmax,hmax);
        tcu::Vector<int,_2>::Vector(&local_19c);
        tcu::Vector<int,_2>::Vector(&local_1a4);
        tcu::Vector<int,_2>::Vector(&local_1ac);
        GatherArgs::GatherArgs(&local_18c,iVar2,&local_194,&local_19c,&local_1a4,&local_1ac);
        std::
        vector<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs>_>
        ::push_back(__return_storage_ptr__,&local_18c);
        iVar2 = local_38;
        tcu::Vector<int,_2>::Vector(&local_1d8,0,local_9c);
        tcu::Vector<int,_2>::Vector(&local_1e0);
        tcu::Vector<int,_2>::Vector(&local_1e8);
        tcu::Vector<int,_2>::Vector(&local_1f0);
        GatherArgs::GatherArgs(&local_1d0,iVar2,&local_1d8,&local_1e0,&local_1e8,&local_1f0);
        std::
        vector<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs>_>
        ::push_back(__return_storage_ptr__,&local_1d0);
        iVar2 = local_38;
        tcu::Vector<int,_2>::Vector(&local_21c,local_98,0);
        tcu::Vector<int,_2>::Vector(&local_224);
        tcu::Vector<int,_2>::Vector(&local_22c);
        tcu::Vector<int,_2>::Vector(&local_234);
        GatherArgs::GatherArgs(&local_214,iVar2,&local_21c,&local_224,&local_22c,&local_234);
        std::
        vector<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs>_>
        ::push_back(__return_storage_ptr__,&local_214);
        iVar2 = local_38;
        tcu::Vector<int,_2>::Vector(&local_260,0,0);
        tcu::Vector<int,_2>::Vector(&local_268);
        tcu::Vector<int,_2>::Vector(&local_270);
        tcu::Vector<int,_2>::Vector(&local_278);
        GatherArgs::GatherArgs(&local_258,iVar2,&local_260,&local_268,&local_270,&local_278);
        std::
        vector<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs>_>
        ::push_back(__return_storage_ptr__,&local_258);
      }
      break;
    case GATHERTYPE_OFFSET_DYNAMIC:
      tcu::Vector<int,_2>::Vector(&local_2a4);
      tcu::Vector<int,_2>::Vector(&local_2ac);
      tcu::Vector<int,_2>::Vector(&local_2b4);
      tcu::Vector<int,_2>::Vector((Vector<int,_2> *)&max_1);
      GatherArgs::GatherArgs(&local_29c,iVar2,&local_2a4,&local_2ac,&local_2b4,(IVec2 *)&max_1);
      std::
      vector<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs>_>
      ::push_back(__return_storage_ptr__,&local_29c);
      break;
    case GATHERTYPE_OFFSETS:
      hmin_1 = tcu::Vector<int,_2>::x(pIStack_28);
      hmax_1 = tcu::Vector<int,_2>::y(pIStack_28);
      local_2c8 = divRoundToZero(hmin_1,2);
      local_2cc = divRoundToZero(hmax_1,2);
      iVar2 = local_38;
      tcu::Vector<int,_2>::Vector(&local_2f8,hmin_1,hmin_1);
      tcu::Vector<int,_2>::Vector(&local_300,hmin_1,hmax_1);
      tcu::Vector<int,_2>::Vector(&local_308,hmax_1,hmin_1);
      tcu::Vector<int,_2>::Vector(&local_310,hmax_1,hmax_1);
      GatherArgs::GatherArgs(&local_2f0,iVar2,&local_2f8,&local_300,&local_308,&local_310);
      std::
      vector<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs>_>
      ::push_back(__return_storage_ptr__,&local_2f0);
      iVar2 = local_38;
      if (local_34 == 0) {
        tcu::Vector<int,_2>::Vector(&local_33c,hmin_1,local_2cc);
        tcu::Vector<int,_2>::Vector(&local_344,local_2c8,hmax_1);
        tcu::Vector<int,_2>::Vector(&local_34c,0,local_2cc);
        tcu::Vector<int,_2>::Vector(&local_354,local_2cc,0);
        GatherArgs::GatherArgs(&local_334,iVar2,&local_33c,&local_344,&local_34c,&local_354);
        std::
        vector<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs>_>
        ::push_back(__return_storage_ptr__,&local_334);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

vector<GatherArgs> generateBasic2DCaseIterations (GatherType gatherType, const tcu::TextureFormat& textureFormat, const IVec2& offsetRange)
{
	const int			numComponentCases	= isDepthFormat(textureFormat) ? 1 : 4+1; // \note For non-depth textures, test explicit components 0 to 3 and implicit component 0.
	vector<GatherArgs>	result;

	for (int componentCaseNdx = 0; componentCaseNdx < numComponentCases; componentCaseNdx++)
	{
		const int componentNdx = componentCaseNdx - 1;

		switch (gatherType)
		{
			case GATHERTYPE_BASIC:
				result.push_back(GatherArgs(componentNdx));
				break;

			case GATHERTYPE_OFFSET:
			{
				const int min	= offsetRange.x();
				const int max	= offsetRange.y();
				const int hmin	= divRoundToZero(min, 2);
				const int hmax	= divRoundToZero(max, 2);

				result.push_back(GatherArgs(componentNdx, IVec2(min, max)));

				if (componentCaseNdx == 0) // Don't test all offsets variants for all color components (they should be pretty orthogonal).
				{
					result.push_back(GatherArgs(componentNdx, IVec2(min,	min)));
					result.push_back(GatherArgs(componentNdx, IVec2(max,	min)));
					result.push_back(GatherArgs(componentNdx, IVec2(max,	max)));

					result.push_back(GatherArgs(componentNdx, IVec2(0,		hmax)));
					result.push_back(GatherArgs(componentNdx, IVec2(hmin,	0)));
					result.push_back(GatherArgs(componentNdx, IVec2(0,		0)));
				}

				break;
			}

			case GATHERTYPE_OFFSET_DYNAMIC:
				result.push_back(GatherArgs(componentNdx));
				break;

			case GATHERTYPE_OFFSETS:
			{
				const int min	= offsetRange.x();
				const int max	= offsetRange.y();
				const int hmin	= divRoundToZero(min, 2);
				const int hmax	= divRoundToZero(max, 2);

				result.push_back(GatherArgs(componentNdx,
											IVec2(min,	min),
											IVec2(min,	max),
											IVec2(max,	min),
											IVec2(max,	max)));

				if (componentCaseNdx == 0) // Don't test all offsets variants for all color components (they should be pretty orthogonal).
					result.push_back(GatherArgs(componentNdx,
												IVec2(min,	hmax),
												IVec2(hmin,	max),
												IVec2(0,	hmax),
												IVec2(hmax,	0)));
				break;
			}

			default:
				DE_ASSERT(false);
		}
	}

	return result;
}